

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSIdent_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field,bool is_upper_camel,bool is_map,bool drop_list)

{
  bool bVar1;
  Descriptor *pDVar2;
  string *extraout_RAX;
  string *extraout_RAX_00;
  undefined7 extraout_var;
  string *psVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  undefined1 local_58 [32];
  _anonymous_namespace_ *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    local_58._0_8_ = FieldDescriptor::TypeOnceInit;
    local_70.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)local_58,
               (FieldDescriptor **)&local_70);
  }
  if (*(int *)(this + 0x38) == 10) {
    if ((char)options == '\0') {
      pDVar2 = FieldDescriptor::message_type((FieldDescriptor *)this);
      anon_unknown_0::ParseUpperCamel(&local_70,*(string **)pDVar2);
      anon_unknown_0::ToLowerCamel((string *)local_58,&local_70);
    }
    else {
      pDVar2 = FieldDescriptor::message_type((FieldDescriptor *)this);
      anon_unknown_0::ParseUpperCamel(&local_70,*(string **)pDVar2);
      anon_unknown_0::ToUpperCamel((string *)local_58,&local_70);
    }
  }
  else if ((char)options == '\0') {
    anon_unknown_0::ParseLowerUnderscore(&local_70,*(string **)this);
    anon_unknown_0::ToLowerCamel((string *)local_58,&local_70);
  }
  else {
    anon_unknown_0::ParseLowerUnderscore(&local_70,*(string **)this);
    anon_unknown_0::ToUpperCamel((string *)local_58,&local_70);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_58);
  if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  psVar3 = extraout_RAX;
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    local_58._0_8_ = FieldDescriptor::TypeOnceInit;
    local_38 = this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)local_58,
               (FieldDescriptor **)&local_38);
    psVar3 = extraout_RAX_00;
  }
  if (*(int *)(this + 0x38) == 0xb) {
    bVar1 = FieldDescriptor::is_map_message_type((FieldDescriptor *)this);
    psVar3 = (string *)CONCAT71(extraout_var,bVar1);
    if (bVar1) goto LAB_002562be;
  }
  if ((char)field != '\0') {
    return psVar3;
  }
  if (*(int *)(this + 0x3c) != 3) {
    return psVar3;
  }
LAB_002562be:
  psVar3 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  return psVar3;
}

Assistant:

std::string JSIdent(const GeneratorOptions& options,
                    const FieldDescriptor* field, bool is_upper_camel,
                    bool is_map, bool drop_list) {
  std::string result;
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    result = is_upper_camel
                 ? ToUpperCamel(ParseUpperCamel(field->message_type()->name()))
                 : ToLowerCamel(ParseUpperCamel(field->message_type()->name()));
  } else {
    result = is_upper_camel ? ToUpperCamel(ParseLowerUnderscore(field->name()))
                            : ToLowerCamel(ParseLowerUnderscore(field->name()));
  }
  if (is_map || field->is_map()) {
    // JSPB-style or proto3-style map.
    result += "Map";
  } else if (!drop_list && field->is_repeated()) {
    // Repeated field.
    result += "List";
  }
  return result;
}